

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderLoopTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderLoopTests::init(ShaderLoopTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  pointer *pppTVar2;
  DataType dataType;
  char *__s;
  Context *context;
  size_type sVar3;
  TestNode *pTVar4;
  _Alloc_hider description;
  _Alloc_hider name_00;
  LoopCountType loopCountType;
  int iVar5;
  int extraout_EAX;
  long *plVar6;
  undefined8 *puVar7;
  TestNode *node;
  size_t sVar8;
  ShaderLoopCase *pSVar9;
  long lVar10;
  LoopRequirement requirement;
  uint uVar11;
  _func_int **pp_Var12;
  size_type *psVar13;
  pointer ppTVar14;
  long *plVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  undefined8 uVar19;
  _Base_ptr p_Var20;
  LoopRequirement LVar21;
  string *psVar22;
  _Alloc_hider _Var23;
  string *psVar24;
  long lVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  long lVar28;
  char *pcVar29;
  bool bVar30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string iterMaxStr;
  string loopBody;
  StringTemplate fragTemplate;
  string vertexShaderSource;
  string initValue;
  string loopCountDeclStr;
  string local_608;
  long local_5e8;
  uint local_5e0;
  LoopRequirement local_5dc;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  _Alloc_hider local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [4];
  ios_base local_568 [264];
  TestNode *local_460;
  string incrementStr;
  string loopCmpStr;
  string desc;
  string name;
  string groupDesc;
  string groupName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  ostringstream vtx;
  ostringstream frag;
  
  lVar16 = 0;
  local_460 = (TestNode *)this;
  do {
    __s = (char *)(&getLoopTypeName(deqp::gles2::Functional::LoopType)::s_names)[lVar16];
    lVar10 = 0;
    local_5e8 = lVar16;
    do {
      puVar26 = &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      pcVar29 = (char *)(&getLoopCountTypeName(deqp::gles2::Functional::LoopCountType)::s_names)
                        [lVar10];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frag,__s,(allocator<char> *)&iterMaxStr);
      plVar6 = (long *)std::__cxx11::string::append((char *)&frag);
      pp_Var12 = (_func_int **)(plVar6 + 2);
      if ((_func_int **)*plVar6 == pp_Var12) {
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)puVar26;
      }
      else {
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
        vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)*plVar6;
      }
      vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
      *plVar6 = (long)pp_Var12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar29,(allocator<char> *)&initValue);
      p_Var20 = (_Base_ptr)0xf;
      if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)puVar26) {
        p_Var20 = (_Base_ptr)vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_;
      }
      if (p_Var20 < (_Base_ptr)
                    (params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                    vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_)) {
        p_Var20 = (_Base_ptr)0xf;
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          p_Var20 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        if (p_Var20 < (_Base_ptr)
                      (params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                      vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_))
        goto LAB_00ef5b49;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&params,0,(char *)0x0,
                            (ulong)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream);
      }
      else {
LAB_00ef5b49:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&vtx,params._M_t._M_impl._0_8_);
      }
      children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      ppTVar14 = (pointer)(puVar7 + 2);
      if ((pointer)*puVar7 == ppTVar14) {
        children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
      }
      else {
        children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
        children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar7;
      }
      children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar7[1];
      *puVar7 = ppTVar14;
      puVar7[1] = 0;
      *(undefined1 *)ppTVar14 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&children);
      groupName._M_dataplus._M_p = (pointer)&groupName.field_2;
      psVar13 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar13) {
        groupName.field_2._M_allocated_capacity = *psVar13;
        groupName.field_2._8_8_ = plVar6[3];
      }
      else {
        groupName.field_2._M_allocated_capacity = *psVar13;
        groupName._M_dataplus._M_p = (pointer)*plVar6;
      }
      groupName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)puVar26) {
        operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)puVar26;
      std::__cxx11::string::_M_construct<char_const*>((string *)&vtx,"Loop tests with ","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&vtx);
      children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      ppTVar14 = (pointer)(plVar6 + 2);
      if ((pointer)*plVar6 == ppTVar14) {
        children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
      }
      else {
        children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
        children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar6;
      }
      children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)plVar6[1];
      *plVar6 = (long)ppTVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&children);
      groupDesc._M_dataplus._M_p = (pointer)&groupDesc.field_2;
      psVar13 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar13) {
        groupDesc.field_2._M_allocated_capacity = *psVar13;
        groupDesc.field_2._8_8_ = plVar6[3];
      }
      else {
        groupDesc.field_2._M_allocated_capacity = *psVar13;
        groupDesc._M_dataplus._M_p = (pointer)*plVar6;
      }
      groupDesc._M_string_length = plVar6[1];
      *plVar6 = (long)psVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)puVar26) {
        operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      node = (TestNode *)operator_new(0x78);
      pTVar4 = local_460;
      pp_Var12 = local_460[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,(TestContext *)*pp_Var12,groupName._M_dataplus._M_p,
                 groupDesc._M_dataplus._M_p);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
      node[1]._vptr_TestNode = pp_Var12;
      tcu::TestNode::addChild(pTVar4,node);
      LVar21 = LOOPREQUIREMENT_STANDARD;
      requirement = (lVar10 != 1) + LOOPREQUIREMENT_UNIFORM;
      if (lVar10 == 0) {
        requirement = LVar21;
      }
      loopCountType = (LoopCountType)lVar10;
      local_5e0 = loopCountType - LOOPCOUNT_UNIFORM;
      if (local_5e8 != 0) {
        requirement = LOOPREQUIREMENT_DYNAMIC;
      }
      do {
        local_5dc = LVar21;
        glu::getPrecisionName(local_5dc);
        lVar16 = 0;
        do {
          dataType = deqp::ShaderLoopTests::init::s_countDataType[lVar16];
          glu::getDataTypeName(dataType);
          uVar11 = dataType - TYPE_INT;
          lVar25 = 0;
          do {
            puVar27 = &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            puVar26 = &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            glu::getShaderTypeName
                      (*(ShaderType *)((long)deqp::ShaderLoopTests::init::s_shaderTypes + lVar25));
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&iterMaxStr,"basic_","");
            plVar6 = (long *)std::__cxx11::string::append((char *)&iterMaxStr);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar15 = plVar6 + 2;
            if ((long *)*plVar6 == plVar15) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
              params._M_t._M_impl._0_8_ = (long *)*plVar6;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
            *plVar6 = (long)plVar15;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&params);
            pp_Var12 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var12) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar26;
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar6;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
            *plVar6 = (long)pp_Var12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&frag);
            pp_Var12 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var12) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar27;
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar6;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
            *plVar6 = (long)pp_Var12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&vtx);
            children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&children.
                           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppTVar14 = (pointer)(plVar6 + 2);
            if ((pointer)*plVar6 == ppTVar14) {
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
            }
            else {
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)*plVar6;
            }
            children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar6[1];
            *plVar6 = (long)ppTVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&children);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar13) {
              name.field_2._M_allocated_capacity = *psVar13;
              name.field_2._8_8_ = plVar6[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar13;
              name._M_dataplus._M_p = (pointer)*plVar6;
            }
            name._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar27) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar26) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCmpStr,__s,(allocator<char> *)&incrementStr);
            plVar6 = (long *)std::__cxx11::string::append((char *)&loopCmpStr);
            loopCountDeclStr._M_dataplus._M_p = (pointer)&loopCountDeclStr.field_2;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar13) {
              loopCountDeclStr.field_2._M_allocated_capacity = *psVar13;
              loopCountDeclStr.field_2._8_8_ = plVar6[3];
            }
            else {
              loopCountDeclStr.field_2._M_allocated_capacity = *psVar13;
              loopCountDeclStr._M_dataplus._M_p = (pointer)*plVar6;
            }
            loopCountDeclStr._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&loopCountDeclStr);
            initValue._M_dataplus._M_p = (pointer)&initValue.field_2;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar13) {
              initValue.field_2._M_allocated_capacity = *psVar13;
              initValue.field_2._8_8_ = plVar6[3];
            }
            else {
              initValue.field_2._M_allocated_capacity = *psVar13;
              initValue._M_dataplus._M_p = (pointer)*plVar6;
            }
            initValue._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&initValue);
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar13) {
              iterMaxStr.field_2._M_allocated_capacity = *psVar13;
              iterMaxStr.field_2._8_8_ = plVar6[3];
            }
            else {
              iterMaxStr.field_2._M_allocated_capacity = *psVar13;
              iterMaxStr._M_dataplus._M_p = (pointer)*plVar6;
            }
            iterMaxStr._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&iterMaxStr);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar15 = plVar6 + 2;
            if ((long *)*plVar6 == plVar15) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
              params._M_t._M_impl._0_8_ = (long *)*plVar6;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
            *plVar6 = (long)plVar15;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&params);
            pp_Var12 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var12) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar26;
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar6;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
            *plVar6 = (long)pp_Var12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&frag);
            pp_Var12 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var12) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar27;
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar6;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
            *plVar6 = (long)pp_Var12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&vtx);
            children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&children.
                           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppTVar14 = (pointer)(plVar6 + 2);
            if ((pointer)*plVar6 == ppTVar14) {
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
            }
            else {
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)*plVar6;
            }
            children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar6[1];
            *plVar6 = (long)ppTVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&children);
            desc._M_dataplus._M_p = (pointer)&desc.field_2;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar13) {
              desc.field_2._M_allocated_capacity = *psVar13;
              desc.field_2._8_8_ = plVar6[3];
            }
            else {
              desc.field_2._M_allocated_capacity = *psVar13;
              desc._M_dataplus._M_p = (pointer)*plVar6;
            }
            desc._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar27) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            pTVar4 = local_460;
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar26) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)initValue._M_dataplus._M_p != &initValue.field_2) {
              operator_delete(initValue._M_dataplus._M_p,initValue.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCountDeclStr._M_dataplus._M_p != &loopCountDeclStr.field_2) {
              operator_delete(loopCountDeclStr._M_dataplus._M_p,
                              loopCountDeclStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCmpStr._M_dataplus._M_p != &loopCmpStr.field_2) {
              operator_delete(loopCmpStr._M_dataplus._M_p,
                              loopCmpStr.field_2._M_allocated_capacity + 1);
            }
            name_00._M_p = name._M_dataplus._M_p;
            description._M_p = desc._M_dataplus._M_p;
            context = (Context *)pTVar4[1]._vptr_TestNode;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            psVar24 = (string *)&frag;
            if (lVar25 == 0) {
              psVar24 = (string *)&vtx;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "attribute highp vec4 a_coords;\n",0x1f);
            if (lVar10 == 2) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "attribute mediump float a_one;\n",0x1f);
            }
            if (lVar25 == 0) {
              lVar28 = 0x1e;
              pcVar29 = "varying mediump vec3 v_color;\n";
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "varying mediump vec3 v_color;\n",0x1e);
LAB_00ef66c7:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar29,lVar28);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "varying mediump vec4 v_coords;\n",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"varying mediump vec4 v_coords;\n",0x1f);
              if (lVar10 == 2) {
                lVar28 = 0x1d;
                pcVar29 = "varying mediump float v_one;\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "varying mediump float v_one;\n",0x1d);
                goto LAB_00ef66c7;
              }
            }
            if (uVar11 < 4) {
              if (local_5e0 < 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar24,"uniform ${COUNTER_PRECISION} int ",0x21);
                pcVar29 = deqp::gls::getIntUniformName(3);
                if (pcVar29 == (char *)0x0) {
                  lVar28 = 2;
                  std::ios::clear((int)*(undefined8 *)(*(long *)psVar24 + -0x18) + (int)psVar24);
                  pcVar29 = ";\n";
                }
                else {
                  sVar8 = strlen(pcVar29);
                  lVar28 = 2;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)psVar24,pcVar29,sVar8);
                  pcVar29 = ";\n";
                }
                goto LAB_00ef67ee;
              }
            }
            else {
              lVar28 = 0x2b;
              if (local_5e0 < 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar24,"uniform ${COUNTER_PRECISION} float ",0x23);
                pcVar29 = deqp::gls::getFloatFractionUniformName(3);
                if (pcVar29 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(*(long *)psVar24 + -0x18) + (int)psVar24);
                }
                else {
                  sVar8 = strlen(pcVar29);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)psVar24,pcVar29,sVar8);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,";\n",2);
                pcVar29 = "uniform ${COUNTER_PRECISION} float uf_one;\n";
              }
              else {
                pcVar29 = "uniform ${COUNTER_PRECISION} float uf_one;\n";
              }
LAB_00ef67ee:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,pcVar29,lVar28);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "\tgl_Position = a_position;\n",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
            psVar22 = (string *)&frag;
            if (lVar25 == 0) {
              psVar22 = (string *)&vtx;
            }
            pcVar29 = "\t${PRECISION} vec4 coords = v_coords;\n";
            if (lVar25 == 0) {
              pcVar29 = "\t${PRECISION} vec4 coords = a_coords;\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar22,pcVar29,0x26);
            if (lVar10 == 2) {
              bVar30 = lVar25 == 0;
              psVar22 = (string *)&frag;
              if (bVar30) {
                psVar22 = (string *)&vtx;
              }
              pcVar29 = "\t${COUNTER_PRECISION} int one = int(v_one + 0.5);\n";
              if (bVar30) {
                pcVar29 = "\t${COUNTER_PRECISION} int one = int(a_one + 0.5);\n";
              }
              pcVar17 = "\t${COUNTER_PRECISION} float one = v_one;\n";
              if (bVar30) {
                pcVar17 = "\t${COUNTER_PRECISION} float one = a_one;\n";
              }
              if (uVar11 < 4) {
                pcVar17 = pcVar29;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar22,pcVar17,(ulong)(uVar11 < 4) * 9 + 0x29);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)psVar24,"\t${PRECISION} vec4 res = coords;\n",0x21);
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            iterMaxStr._M_string_length = 0;
            iterMaxStr.field_2._M_allocated_capacity =
                 iterMaxStr.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (uVar11 < 4) {
              if (loopCountType == LOOPCOUNT_UNIFORM) {
                pcVar29 = deqp::gls::getIntUniformName(3);
                sVar3 = iterMaxStr._M_string_length;
                strlen(pcVar29);
                std::__cxx11::string::_M_replace((ulong)&iterMaxStr,0,(char *)sVar3,(ulong)pcVar29);
                pcVar17 = "0";
              }
              else {
                if (loopCountType == LOOPCOUNT_CONSTANT) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&children);
                  std::ostream::operator<<((ostringstream *)&children,3);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&children);
                  std::ios_base::~ios_base(local_568);
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&params);
                }
                else {
                  pcVar17 = "0";
                  if (lVar10 != 2) goto LAB_00ef6b5a;
                  pcVar29 = deqp::gls::getIntUniformName(3);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&params,pcVar29,(allocator<char> *)&initValue);
                  plVar6 = (long *)std::__cxx11::string::append((char *)&params);
                  pppTVar2 = &children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
                  ppTVar14 = (pointer)(plVar6 + 2);
                  if ((pointer)*plVar6 == ppTVar14) {
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)pppTVar2;
                  }
                  else {
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
                  }
                  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[1];
                  *plVar6 = (long)ppTVar14;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&children);
                  if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)pppTVar2) {
                    operator_delete(children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)children.
                                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                  }
                }
                if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                    &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)params._M_t._M_impl._0_8_,
                                  (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent)->_M_color + 1));
                }
                pcVar17 = "0";
              }
            }
            else {
              if (loopCountType == LOOPCOUNT_CONSTANT) {
                pcVar29 = "1.0";
              }
              else if (loopCountType == LOOPCOUNT_UNIFORM) {
                pcVar29 = "uf_one";
              }
              else {
                pcVar29 = "uf_one*one";
                pcVar17 = "0.05";
                if (lVar10 != 2) goto LAB_00ef6b5a;
              }
              std::__cxx11::string::_M_replace((ulong)&iterMaxStr,0,(char *)0x0,(ulong)pcVar29);
              pcVar17 = "0.05";
            }
LAB_00ef6b5a:
            initValue._M_dataplus._M_p = (pointer)&initValue.field_2;
            sVar8 = strlen(pcVar17);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&initValue,pcVar17,pcVar17 + sVar8);
            std::operator+(&loopCountDeclStr,"${COUNTER_PRECISION} ${LOOP_VAR_TYPE} ndx = ",
                           &initValue);
            std::operator+(&loopCmpStr,"ndx < ",&iterMaxStr);
            incrementStr._M_dataplus._M_p = (pointer)&incrementStr.field_2;
            incrementStr._M_string_length = 0;
            incrementStr.field_2._M_local_buf[0] = '\0';
            if (uVar11 < 4) {
              std::__cxx11::string::_M_replace((ulong)&incrementStr,0,(char *)0x0,0x1bc2336);
            }
            else {
              if (loopCountType == LOOPCOUNT_UNIFORM) {
                params._M_t._M_impl._0_8_ =
                     &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x203d2b2078646e;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 7;
                params._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                deqp::gls::getFloatFractionUniformName(3);
                plVar6 = (long *)std::__cxx11::string::append((char *)&params);
                pppTVar2 = &children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                ppTVar14 = (pointer)(plVar6 + 2);
                if ((pointer)*plVar6 == ppTVar14) {
                  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)pppTVar2;
                }
                else {
                  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
                }
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[1];
                *plVar6 = (long)ppTVar14;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::operator=((string *)&incrementStr,(string *)&children);
                if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)pppTVar2) {
                  operator_delete(children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)children.
                                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                }
                p_Var20 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                _Var23._M_p = (pointer)params._M_t._M_impl._0_8_;
                if ((_Base_ptr *)params._M_t._M_impl._0_8_ ==
                    &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                goto LAB_00ef6fe2;
              }
              else {
                if (loopCountType == LOOPCOUNT_CONSTANT) {
                  loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
                  loopBody.field_2._M_local_buf[0] = 'n';
                  loopBody.field_2._M_allocated_capacity._1_2_ = 0x7864;
                  loopBody.field_2._M_allocated_capacity._3_4_ = 0x203d2b20;
                  loopBody._M_string_length = 7;
                  loopBody.field_2._M_local_buf[7] = '\0';
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&children);
                  std::ostream::_M_insert<double>(0.3333333432674408);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&children);
                  std::ios_base::~ios_base(local_568);
                  uVar18 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)loopBody._M_dataplus._M_p != &loopBody.field_2) {
                    uVar18 = CONCAT17(loopBody.field_2._M_local_buf[7],
                                      CONCAT43(loopBody.field_2._M_allocated_capacity._3_4_,
                                               CONCAT21(loopBody.field_2._M_allocated_capacity._1_2_
                                                        ,loopBody.field_2._M_local_buf[0])));
                  }
                  if (uVar18 < fragTemplate.m_template._M_string_length + loopBody._M_string_length)
                  {
                    uVar19 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)fragTemplate.m_template._M_dataplus._M_p !=
                        &fragTemplate.m_template.field_2) {
                      uVar19 = fragTemplate.m_template.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar19 <
                        fragTemplate.m_template._M_string_length + loopBody._M_string_length)
                    goto LAB_00ef6cec;
                    puVar7 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&fragTemplate,0,(char *)0x0,
                                        (ulong)loopBody._M_dataplus._M_p);
                  }
                  else {
LAB_00ef6cec:
                    puVar7 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&loopBody,
                                        (ulong)fragTemplate.m_template._M_dataplus._M_p);
                  }
                  params._M_t._M_impl._0_8_ =
                       &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  puVar1 = puVar7 + 2;
                  if ((undefined8 *)*puVar7 == puVar1) {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*puVar1;
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         (_Base_ptr)puVar7[3];
                  }
                  else {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*puVar1;
                    params._M_t._M_impl._0_8_ = (undefined8 *)*puVar7;
                  }
                  params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar7[1];
                  *puVar7 = puVar1;
                  puVar7[1] = 0;
                  *(undefined1 *)puVar1 = 0;
                  std::__cxx11::string::operator=((string *)&incrementStr,(string *)&params);
                  if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                      &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)params._M_t._M_impl._0_8_,
                                    (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header.
                                                    _M_header._M_parent)->_M_color + 1));
                  }
                  uVar19 = fragTemplate.m_template.field_2._M_allocated_capacity;
                  _Var23._M_p = fragTemplate.m_template._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)fragTemplate.m_template._M_dataplus._M_p !=
                      &fragTemplate.m_template.field_2) {
LAB_00ef6fbe:
                    operator_delete(_Var23._M_p,(ulong)((long)&((_Base_ptr)uVar19)->_M_color + 1));
                  }
                }
                else {
                  if (lVar10 != 2) goto LAB_00ef6fe2;
                  loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
                  loopBody.field_2._M_local_buf[0] = 'n';
                  loopBody.field_2._M_allocated_capacity._1_2_ = 0x7864;
                  loopBody.field_2._M_allocated_capacity._3_4_ = 0x203d2b20;
                  loopBody._M_string_length = 7;
                  loopBody.field_2._M_local_buf[7] = '\0';
                  deqp::gls::getFloatFractionUniformName(3);
                  plVar6 = (long *)std::__cxx11::string::append((char *)&loopBody);
                  params._M_t._M_impl._0_8_ =
                       &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  plVar15 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar15) {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*plVar15;
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         (_Base_ptr)plVar6[3];
                  }
                  else {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*plVar15;
                    params._M_t._M_impl._0_8_ = (long *)*plVar6;
                  }
                  params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
                  *plVar6 = (long)plVar15;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append((char *)&params);
                  pppTVar2 = &children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
                  ppTVar14 = (pointer)(plVar6 + 2);
                  if ((pointer)*plVar6 == ppTVar14) {
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)pppTVar2;
                  }
                  else {
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                    children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
                  }
                  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[1];
                  *plVar6 = (long)ppTVar14;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&incrementStr,(string *)&children);
                  if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)pppTVar2) {
                    operator_delete(children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)children.
                                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                  }
                  uVar19 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  _Var23._M_p = (pointer)params._M_t._M_impl._0_8_;
                  if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                      &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                  goto LAB_00ef6fbe;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)loopBody._M_dataplus._M_p == &loopBody.field_2) goto LAB_00ef6fe2;
                p_Var20 = (_Base_ptr)
                          CONCAT17(loopBody.field_2._M_local_buf[7],
                                   CONCAT43(loopBody.field_2._M_allocated_capacity._3_4_,
                                            CONCAT21(loopBody.field_2._M_allocated_capacity._1_2_,
                                                     loopBody.field_2._M_local_buf[0])));
                _Var23._M_p = loopBody._M_dataplus._M_p;
              }
              operator_delete(_Var23._M_p,(ulong)((long)&p_Var20->_M_color + 1));
            }
LAB_00ef6fe2:
            loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
            loopBody._M_string_length = 0;
            loopBody.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_replace((ulong)&loopBody,0,(char *)0x0,0x1bfea71);
            if (local_5e8 == 0) {
              std::operator+(&local_340,"\tfor (",&loopCountDeclStr);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_340);
              local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_608.field_2._M_allocated_capacity = *psVar13;
                local_608.field_2._8_8_ = plVar6[3];
              }
              else {
                local_608.field_2._M_allocated_capacity = *psVar13;
                local_608._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_608._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_608,(ulong)loopCmpStr._M_dataplus._M_p);
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar13) {
                vertexShaderSource.field_2._M_allocated_capacity = *psVar13;
                vertexShaderSource.field_2._8_8_ = plVar6[3];
              }
              else {
                vertexShaderSource.field_2._M_allocated_capacity = *psVar13;
                vertexShaderSource._M_dataplus._M_p = (pointer)*plVar6;
              }
              vertexShaderSource._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar6[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar6;
              }
              fragTemplate.m_template._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&fragTemplate,(ulong)incrementStr._M_dataplus._M_p
                                         );
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar15 = plVar6 + 2;
              if ((long *)*plVar6 == plVar15) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl._0_8_ = (long *)*plVar6;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
              *plVar6 = (long)plVar15;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&params);
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              ppTVar14 = (pointer)(plVar6 + 2);
              if ((pointer)*plVar6 == ppTVar14) {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              }
              else {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
              }
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar6[1];
              *plVar6 = (long)ppTVar14;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,
                         (char *)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(children.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p,
                                local_608.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_dataplus._M_p != &local_340.field_2) {
                operator_delete(local_340._M_dataplus._M_p,
                                local_340.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,"\t{\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,loopBody._M_dataplus._M_p,loopBody._M_string_length);
LAB_00ef77ee:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,"\t}\n",3);
            }
            else if ((int)local_5e8 == 2) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,"\t",1);
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&children,loopCountDeclStr._M_dataplus._M_p,
                         loopCountDeclStr._M_dataplus._M_p + loopCountDeclStr._M_string_length);
              std::__cxx11::string::append((char *)&children);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,
                         (char *)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(children.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,"\tdo\n",4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,"\t{\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,loopBody._M_dataplus._M_p,loopBody._M_string_length);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t\t",&incrementStr);
              plVar6 = (long *)std::__cxx11::string::append((char *)&params);
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              ppTVar14 = (pointer)(plVar6 + 2);
              if ((pointer)*plVar6 == ppTVar14) {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              }
              else {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
              }
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar6[1];
              *plVar6 = (long)ppTVar14;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,
                         (char *)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(children.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t} while (",&loopCmpStr);
              plVar6 = (long *)std::__cxx11::string::append((char *)&params);
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              ppTVar14 = (pointer)(plVar6 + 2);
              if ((pointer)*plVar6 == ppTVar14) {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              }
              else {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
              }
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar6[1];
              *plVar6 = (long)ppTVar14;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,
                         (char *)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(children.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
            }
            else if ((int)local_5e8 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,"\t",1);
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&children,loopCountDeclStr._M_dataplus._M_p,
                         loopCountDeclStr._M_dataplus._M_p + loopCountDeclStr._M_string_length);
              std::__cxx11::string::append((char *)&children);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,
                         (char *)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(children.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\twhile (",&loopCmpStr);
              plVar6 = (long *)std::__cxx11::string::append((char *)&params);
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              ppTVar14 = (pointer)(plVar6 + 2);
              if ((pointer)*plVar6 == ppTVar14) {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              }
              else {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
              }
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar6[1];
              *plVar6 = (long)ppTVar14;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,
                         (char *)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(children.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,"\t{\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,loopBody._M_dataplus._M_p,loopBody._M_string_length);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t\t",&incrementStr);
              plVar6 = (long *)std::__cxx11::string::append((char *)&params);
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start =
                   (pointer)&children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              ppTVar14 = (pointer)(plVar6 + 2);
              if ((pointer)*plVar6 == ppTVar14) {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              }
              else {
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
                children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
              }
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar6[1];
              *plVar6 = (long)ppTVar14;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar24,
                         (char *)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                         (long)children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(children.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              goto LAB_00ef77ee;
            }
            if (lVar25 == 0) {
              lVar28 = 0x28;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\tv_color = res.rgb;\n",0x14);
              pcVar29 = "\tgl_FragColor = vec4(v_color.rgb, 1.0);\n";
              psVar24 = (string *)&frag;
LAB_00ef787c:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar24,pcVar29,lVar28);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\tv_coords = a_coords;\n",0x16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"\tgl_FragColor = vec4(res.rgb, 1.0);\n",0x24);
              lVar28 = 0x10;
              pcVar29 = "\tv_one = a_one;\n";
              psVar24 = (string *)&vtx;
              if (lVar10 == 2) goto LAB_00ef787c;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[14],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&children,(char (*) [14])"LOOP_VAR_TYPE",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&children);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8._M_p != local_5a8) {
              operator_delete(local_5b8._M_p,local_5a8[0]._M_allocated_capacity + 1);
            }
            if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&children,(char (*) [10])0x1cf2bdb,(char (*) [8])0x1c00dfd);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&children);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8._M_p != local_5a8) {
              operator_delete(local_5b8._M_p,local_5a8[0]._M_allocated_capacity + 1);
            }
            if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            fragTemplate.m_template._M_dataplus._M_p = glu::getPrecisionName(local_5dc);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[18],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&children,(char (*) [18])"COUNTER_PRECISION",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&children);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8._M_p != local_5a8) {
              operator_delete(local_5b8._M_p,local_5a8[0]._M_allocated_capacity + 1);
            }
            if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                       (allocator<char> *)&local_608);
            tcu::StringTemplate::StringTemplate
                      ((StringTemplate *)&children,&fragTemplate.m_template);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
              operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                              fragTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertexShaderSource,local_608._M_dataplus._M_p,
                       (allocator<char> *)&local_340);
            tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._M_dataplus._M_p != &local_608.field_2) {
              operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1
                             );
            }
            tcu::StringTemplate::specialize(&vertexShaderSource,(StringTemplate *)&children,&params)
            ;
            tcu::StringTemplate::specialize(&local_608,&fragTemplate,&params);
            pSVar9 = (ShaderLoopCase *)operator_new(0x130);
            ShaderLoopCase::ShaderLoopCase
                      (pSVar9,context,name_00._M_p,description._M_p,lVar25 == 0,evalLoop3Iters,
                       requirement,vertexShaderSource._M_dataplus._M_p,local_608._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._M_dataplus._M_p != &local_608.field_2) {
              operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate((StringTemplate *)&children);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&params._M_t);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopBody._M_dataplus._M_p != &loopBody.field_2) {
              operator_delete(loopBody._M_dataplus._M_p,
                              CONCAT17(loopBody.field_2._M_local_buf[7],
                                       CONCAT43(loopBody.field_2._M_allocated_capacity._3_4_,
                                                CONCAT21(loopBody.field_2._M_allocated_capacity.
                                                         _1_2_,loopBody.field_2._M_local_buf[0]))) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)incrementStr._M_dataplus._M_p != &incrementStr.field_2) {
              operator_delete(incrementStr._M_dataplus._M_p,
                              CONCAT71(incrementStr.field_2._M_allocated_capacity._1_7_,
                                       incrementStr.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCmpStr._M_dataplus._M_p != &loopCmpStr.field_2) {
              operator_delete(loopCmpStr._M_dataplus._M_p,
                              loopCmpStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCountDeclStr._M_dataplus._M_p != &loopCountDeclStr.field_2) {
              operator_delete(loopCountDeclStr._M_dataplus._M_p,
                              loopCountDeclStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)initValue._M_dataplus._M_p != &initValue.field_2) {
              operator_delete(initValue._M_dataplus._M_p,initValue.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            tcu::TestNode::addChild(node,(TestNode *)pSVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)desc._M_dataplus._M_p != &desc.field_2) {
              operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
            }
            puVar26 = &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            lVar25 = lVar25 + 4;
          } while (lVar25 == 4);
          bVar30 = lVar16 == 0;
          lVar16 = lVar16 + 1;
        } while (bVar30);
        LVar21 = local_5dc + LOOPREQUIREMENT_UNIFORM;
      } while (local_5dc + LOOPREQUIREMENT_UNIFORM != LOOPREQUIREMENT_LAST);
      lVar25 = 0;
      lVar16 = local_5e8;
      do {
        if (lVar25 != 7 || lVar16 != 2) {
          pcVar29 = *(char **)(getLoopCaseName(deqp::gles2::Functional::LoopCase)::s_names +
                              lVar25 * 8);
          lVar28 = 0;
          do {
            glu::getShaderTypeName
                      (*(ShaderType *)((long)deqp::ShaderLoopTests::init::s_shaderTypes + lVar28));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&frag,pcVar29,(allocator<char> *)&params);
            plVar6 = (long *)std::__cxx11::string::append((char *)&frag);
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var12 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var12) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar6;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
            *plVar6 = (long)pp_Var12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&vtx);
            children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&children.
                           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppTVar14 = (pointer)(plVar6 + 2);
            if ((pointer)*plVar6 == ppTVar14) {
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
            }
            else {
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
              children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)*plVar6;
            }
            children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar6[1];
            *plVar6 = (long)ppTVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar26) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCountDeclStr,pcVar29,(allocator<char> *)&loopCmpStr);
            plVar6 = (long *)std::__cxx11::string::append((char *)&loopCountDeclStr);
            initValue._M_dataplus._M_p = (pointer)&initValue.field_2;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar13) {
              initValue.field_2._M_allocated_capacity = *psVar13;
              initValue.field_2._8_8_ = plVar6[3];
            }
            else {
              initValue.field_2._M_allocated_capacity = *psVar13;
              initValue._M_dataplus._M_p = (pointer)*plVar6;
            }
            initValue._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&initValue);
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar13) {
              iterMaxStr.field_2._M_allocated_capacity = *psVar13;
              iterMaxStr.field_2._8_8_ = plVar6[3];
            }
            else {
              iterMaxStr.field_2._M_allocated_capacity = *psVar13;
              iterMaxStr._M_dataplus._M_p = (pointer)*plVar6;
            }
            iterMaxStr._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&iterMaxStr);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar15 = plVar6 + 2;
            if ((long *)*plVar6 == plVar15) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
              params._M_t._M_impl._0_8_ = (long *)*plVar6;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
            *plVar6 = (long)plVar15;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&params);
            pp_Var12 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var12) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar26;
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar6;
            }
            puVar27 = &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
            *plVar6 = (long)pp_Var12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&frag);
            pp_Var12 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var12) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar6[3];
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar27;
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var12;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar6;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar6[1];
            *plVar6 = (long)pp_Var12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar26) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)initValue._M_dataplus._M_p != &initValue.field_2) {
              operator_delete(initValue._M_dataplus._M_p,initValue.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCountDeclStr._M_dataplus._M_p != &loopCountDeclStr.field_2) {
              operator_delete(loopCountDeclStr._M_dataplus._M_p,
                              loopCountDeclStr.field_2._M_allocated_capacity + 1);
            }
            pSVar9 = createSpecialLoopCase
                               ((Context *)local_460[1]._vptr_TestNode,
                                (char *)children.
                                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                (char *)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream,lVar28 == 0,(LoopCase)lVar25,
                                (LoopType)local_5e8,loopCountType);
            tcu::TestNode::addChild(node,(TestNode *)pSVar9);
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar27) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            lVar16 = local_5e8;
            if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)children.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            lVar28 = lVar28 + 4;
          } while (lVar28 == 4);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x1d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)groupDesc._M_dataplus._M_p != &groupDesc.field_2) {
        operator_delete(groupDesc._M_dataplus._M_p,groupDesc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)groupName._M_dataplus._M_p != &groupName.field_2) {
        operator_delete(groupName._M_dataplus._M_p,groupName.field_2._M_allocated_capacity + 1);
      }
      pTVar4 = local_460;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar16 = local_5e8 + 1;
    if (lVar16 == 3) {
      pp_Var12 = local_460[1]._vptr_TestNode;
      deqp::gls::ShaderLibrary::ShaderLibrary
                ((ShaderLibrary *)&vtx,(TestContext *)*pp_Var12,(RenderContext *)pp_Var12[1],
                 (ContextInfo *)pp_Var12[2]);
      deqp::gls::ShaderLibrary::loadShaderFile(&children,(ShaderLibrary *)&vtx,"shaders/loops.test")
      ;
      deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&vtx);
      iVar5 = (int)((ulong)((long)children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (0 < iVar5) {
        lVar16 = 0;
        do {
          tcu::TestNode::addChild
                    (pTVar4,children.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar16]);
          lVar16 = lVar16 + 1;
          iVar5 = (int)((ulong)((long)children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)children.
                                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
        } while (lVar16 < iVar5);
      }
      if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        iVar5 = extraout_EAX;
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

void ShaderLoopTests::init (void)
{
	// Loop cases.

	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_countDataType[] =
	{
		TYPE_INT,
		TYPE_FLOAT
	};

	for (int loopType = 0; loopType < LOOPTYPE_LAST; loopType++)
	{
		const char* loopTypeName = getLoopTypeName((LoopType)loopType);

		for (int loopCountType = 0; loopCountType < LOOPCOUNT_LAST; loopCountType++)
		{
			const char* loopCountName = getLoopCountTypeName((LoopCountType)loopCountType);

			string groupName = string(loopTypeName) + "_" + string(loopCountName) + "_iterations";
			string groupDesc = string("Loop tests with ") + loopCountName + " loop counter.";
			TestCaseGroup* group = new TestCaseGroup(m_context, groupName.c_str(), groupDesc.c_str());
			addChild(group);

			// Generic cases.

			for (int precision = 0; precision < PRECISION_LAST; precision++)
			{
				const char* precisionName = getPrecisionName((Precision)precision);

				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_countDataType); dataTypeNdx++)
				{
					DataType loopDataType = s_countDataType[dataTypeNdx];
					const char* dataTypeName = getDataTypeName(loopDataType);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char*	shaderTypeName	= getShaderTypeName(shaderType);
						bool		isVertexCase	= (shaderType == SHADERTYPE_VERTEX);

						string name = string("basic_") + precisionName + "_" + dataTypeName + "_" + shaderTypeName;
						string desc = string(loopTypeName) + " loop with " + precisionName + dataTypeName + " " + loopCountName + " iteration count in " + shaderTypeName + " shader.";
						group->addChild(createGenericLoopCase(m_context, name.c_str(), desc.c_str(), isVertexCase, (LoopType)loopType, (LoopCountType)loopCountType, (Precision)precision, loopDataType));
					}
				}
			}

			// Special cases.

			for (int loopCase = 0; loopCase < LOOPCASE_LAST; loopCase++)
			{
				const char* loopCaseName = getLoopCaseName((LoopCase)loopCase);

				// no-iterations not possible with do-while.
				if ((loopCase == LOOPCASE_NO_ITERATIONS) && (loopType == LOOPTYPE_DO_WHILE))
					continue;

				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					bool		isVertexCase	= (shaderType == SHADERTYPE_VERTEX);

					string name = string(loopCaseName) + "_" + shaderTypeName;
					string desc = string(loopCaseName) + " loop with " + loopTypeName + " iteration count in " + shaderTypeName + " shader.";
					group->addChild(createSpecialLoopCase(m_context, name.c_str(), desc.c_str(), isVertexCase, (LoopCase)loopCase, (LoopType)loopType, (LoopCountType)loopCountType));
				}
			}
		}
	}

	// Additional smaller handwritten tests.
	const std::vector<tcu::TestNode*> children = gls::ShaderLibrary(m_context.getTestContext(), m_context.getRenderContext(), m_context.getContextInfo()).loadShaderFile("shaders/loops.test");
	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}